

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-spawn.c
# Opt level: O2

void spawn_stdin_stdout(void)

{
  ssize_t sVar1;
  int *piVar2;
  undefined8 uVar3;
  char *pcVar4;
  char *pcVar5;
  int64_t eval_b;
  int64_t eval_a;
  char buf [1024];
  
LAB_0017a394:
  eval_a = read(0,buf,0x400);
  if (eval_a == 0xffffffffffffffff) goto LAB_0017a3b3;
  if (eval_a == 0) {
    return;
  }
  goto LAB_0017a3bd;
LAB_0017a3b3:
  piVar2 = __errno_location();
  if (*piVar2 != 4) {
LAB_0017a3bd:
    pcVar4 = buf;
    if (eval_a < 1) {
      pcVar5 = ">";
      pcVar4 = "r";
      uVar3 = 0x867;
LAB_0017a463:
      fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-spawn.c"
              ,uVar3,pcVar4,pcVar5,"0",eval_a,pcVar5,0);
      abort();
    }
    for (; eval_a != 0; eval_a = eval_a - sVar1) {
      do {
        sVar1 = write(1,pcVar4,eval_a);
        if (sVar1 != -1) break;
        piVar2 = __errno_location();
      } while (*piVar2 == 4);
      if (sVar1 < 0) {
        pcVar5 = ">=";
        pcVar4 = "w";
        uVar3 = 0x86e;
        eval_a = sVar1;
        goto LAB_0017a463;
      }
      pcVar4 = pcVar4 + sVar1;
    }
  }
  goto LAB_0017a394;
}

Assistant:

void spawn_stdin_stdout(void) {
  char buf[1024];
  char* pbuf;
  for (;;) {
    ssize_t r, w, c;
    do {
      r = read(0, buf, sizeof buf);
    } while (r == -1 && errno == EINTR);
    if (r == 0) {
      return;
    }
    ASSERT_GT(r, 0);
    c = r;
    pbuf = buf;
    while (c) {
      do {
        w = write(1, pbuf, (size_t)c);
      } while (w == -1 && errno == EINTR);
      ASSERT_GE(w, 0);
      pbuf = pbuf + w;
      c = c - w;
    }
  }
}